

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

void __thiscall
CCoinsViewCache::CCoinsViewCache(CCoinsViewCache *this,CCoinsView *baseIn,bool deterministic)

{
  byte in_DL;
  SaltedOutpointHasher *in_RDI;
  long in_FS_OFFSET;
  PoolResource<144UL,_8UL> *in_stack_ffffffffffffff78;
  CCoinsCacheEntry *in_stack_ffffffffffffff80;
  CCoinsViewBacked *in_stack_ffffffffffffff88;
  hasher *__hf;
  SaltedOutpointHasher *__n;
  SaltedOutpointHasher *this_00;
  undefined1 deterministic_00;
  hasher local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CCoinsViewBacked::CCoinsViewBacked
            (in_stack_ffffffffffffff88,(CCoinsView *)in_stack_ffffffffffffff80);
  in_RDI->k0 = (uint64_t)&PTR_GetCoin_006928e8;
  *(byte *)&in_RDI[1].k0 = in_DL & 1;
  uint256::uint256((uint256 *)in_stack_ffffffffffffff78);
  deterministic_00 = (undefined1)((ulong)&in_RDI[3].k1 >> 0x38);
  PoolResource<144UL,_8UL>::PoolResource(in_stack_ffffffffffffff78);
  this_00 = in_RDI + 0x10;
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffff78);
  __n = in_RDI + 0x17;
  SaltedOutpointHasher::SaltedOutpointHasher(in_RDI,(bool)deterministic_00);
  __hf = local_28;
  PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>::PoolAllocator
            ((PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL> *)
             in_stack_ffffffffffffff78,(ResourceType *)0x16e152);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::unordered_map((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                   *)this_00,(size_type)__n,__hf,(key_equal *)in_stack_ffffffffffffff80,
                  (allocator_type *)in_stack_ffffffffffffff78);
  in_RDI[0x1c].k0 = 0;
  CCoinsCacheEntry::SelfRef(in_stack_ffffffffffffff80,(CoinsCachePair *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsViewCache::CCoinsViewCache(CCoinsView* baseIn, bool deterministic) :
    CCoinsViewBacked(baseIn), m_deterministic(deterministic),
    cacheCoins(0, SaltedOutpointHasher(/*deterministic=*/deterministic), CCoinsMap::key_equal{}, &m_cache_coins_memory_resource)
{
    m_sentinel.second.SelfRef(m_sentinel);
}